

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateFallback(Arena *this,size_t bytes)

{
  char *pcVar1;
  Arena *in_RSI;
  long *in_RDI;
  char *result;
  char *result_1;
  size_t in_stack_ffffffffffffffe0;
  char *local_8;
  
  if (in_RSI < (Arena *)0x401) {
    pcVar1 = AllocateNewBlock(in_RSI,in_stack_ffffffffffffffe0);
    *in_RDI = (long)pcVar1;
    in_RDI[1] = 0x1000;
    local_8 = (char *)*in_RDI;
    *in_RDI = (long)&in_RSI->alloc_ptr_ + *in_RDI;
    in_RDI[1] = in_RDI[1] - (long)in_RSI;
  }
  else {
    local_8 = AllocateNewBlock(in_RSI,in_stack_ffffffffffffffe0);
  }
  return local_8;
}

Assistant:

char* Arena::AllocateFallback(size_t bytes) {
  if (bytes > kBlockSize / 4) {
    // Object is more than a quarter of our block size.  Allocate it separately
    // to avoid wasting too much space in leftover bytes.
    char* result = AllocateNewBlock(bytes);
    return result;
  }

  // We waste the remaining space in the current block.
  alloc_ptr_ = AllocateNewBlock(kBlockSize);
  alloc_bytes_remaining_ = kBlockSize;

  char* result = alloc_ptr_;
  alloc_ptr_ += bytes;
  alloc_bytes_remaining_ -= bytes;
  return result;
}